

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O0

void processSimpleTypeDefinition(XSSimpleTypeDefinition *xsSimpleTypeDef)

{
  XMLCh *pXVar1;
  ostream *poVar2;
  XMLSize_t XVar3;
  ulong uVar4;
  char16_t *pcVar5;
  StrX local_b0;
  uint local_a4;
  BaseRefVectorOf<char16_t> *pBStack_a0;
  uint i_1;
  StringList *lexicalEnums;
  StrX local_90;
  StrX local_88;
  StrX local_80;
  StrX local_78;
  StrX local_70;
  StrX local_68;
  StrX local_60;
  uint local_54;
  StringList *pSStack_50;
  uint i;
  StringList *lexicalPatterns;
  StrX local_40;
  StrX local_38;
  uint local_30;
  int facets;
  StrX local_20;
  long *local_18;
  XSTypeDefinition *xsBaseTypeDef;
  XSSimpleTypeDefinition *xsSimpleTypeDef_local;
  
  xsBaseTypeDef = (XSTypeDefinition *)xsSimpleTypeDef;
  local_18 = (long *)(**(code **)(*(long *)xsSimpleTypeDef + 0x30))();
  std::operator<<((ostream *)&std::cout,"Base:\t\t\t");
  pXVar1 = (XMLCh *)(**(code **)(*local_18 + 0x10))();
  StrX::StrX(&local_20,pXVar1);
  poVar2 = operator<<((ostream *)&std::cout,&local_20);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  StrX::~StrX(&local_20);
  local_30 = xercesc_4_0::XSSimpleTypeDefinition::getDefinedFacets
                       ((XSSimpleTypeDefinition *)xsBaseTypeDef);
  if (local_30 != 0) {
    std::operator<<((ostream *)&std::cout,"Facets:\n");
    if ((local_30 & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\tLength:\t\t");
      pXVar1 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue
                                  ((FACET)xsBaseTypeDef);
      StrX::StrX(&local_38,pXVar1);
      poVar2 = operator<<(poVar2,&local_38);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      StrX::~StrX(&local_38);
    }
    if ((local_30 & 2) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\tMinLength:\t");
      pXVar1 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue
                                  ((FACET)xsBaseTypeDef);
      StrX::StrX(&local_40,pXVar1);
      poVar2 = operator<<(poVar2,&local_40);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      StrX::~StrX(&local_40);
    }
    if ((local_30 & 4) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\tMaxLength:\t");
      pXVar1 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue
                                  ((FACET)xsBaseTypeDef);
      StrX::StrX((StrX *)&lexicalPatterns,pXVar1);
      poVar2 = operator<<(poVar2,(StrX *)&lexicalPatterns);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      StrX::~StrX((StrX *)&lexicalPatterns);
    }
    if ((((local_30 & 8) != 0) &&
        (pSStack_50 = xercesc_4_0::XSSimpleTypeDefinition::getLexicalPattern
                                ((XSSimpleTypeDefinition *)xsBaseTypeDef),
        pSStack_50 != (StringList *)0x0)) &&
       (XVar3 = xercesc_4_0::BaseRefVectorOf<char16_t>::size
                          ((BaseRefVectorOf<char16_t> *)pSStack_50), XVar3 != 0)) {
      std::operator<<((ostream *)&std::cout,"\tPattern:\t\t");
      for (local_54 = 0; uVar4 = (ulong)local_54,
          XVar3 = xercesc_4_0::BaseRefVectorOf<char16_t>::size
                            ((BaseRefVectorOf<char16_t> *)pSStack_50), uVar4 < XVar3;
          local_54 = local_54 + 1) {
        pcVar5 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                           ((BaseRefVectorOf<char16_t> *)pSStack_50,(ulong)local_54);
        StrX::StrX(&local_60,pcVar5);
        operator<<((ostream *)&std::cout,&local_60);
        StrX::~StrX(&local_60);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
    if ((local_30 & 0x10) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\tWhitespace:\t\t");
      pXVar1 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue
                                  ((FACET)xsBaseTypeDef);
      StrX::StrX(&local_68,pXVar1);
      poVar2 = operator<<(poVar2,&local_68);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      StrX::~StrX(&local_68);
    }
    if ((local_30 & 0x20) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\tMaxInclusive:\t");
      pXVar1 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue
                                  ((FACET)xsBaseTypeDef);
      StrX::StrX(&local_70,pXVar1);
      poVar2 = operator<<(poVar2,&local_70);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      StrX::~StrX(&local_70);
    }
    if ((local_30 & 0x40) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\tMaxExclusive:\t");
      pXVar1 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue
                                  ((FACET)xsBaseTypeDef);
      StrX::StrX(&local_78,pXVar1);
      poVar2 = operator<<(poVar2,&local_78);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      StrX::~StrX(&local_78);
    }
    if ((local_30 & 0x80) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\tMinExclusive:\t");
      pXVar1 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue
                                  ((FACET)xsBaseTypeDef);
      StrX::StrX(&local_80,pXVar1);
      poVar2 = operator<<(poVar2,&local_80);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      StrX::~StrX(&local_80);
    }
    if ((local_30 & 0x100) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\tMinInclusive:\t");
      pXVar1 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue
                                  ((FACET)xsBaseTypeDef);
      StrX::StrX(&local_88,pXVar1);
      poVar2 = operator<<(poVar2,&local_88);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      StrX::~StrX(&local_88);
    }
    if ((local_30 & 0x200) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\tTotalDigits:\t");
      pXVar1 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue
                                  ((FACET)xsBaseTypeDef);
      StrX::StrX(&local_90,pXVar1);
      poVar2 = operator<<(poVar2,&local_90);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      StrX::~StrX(&local_90);
    }
    if ((local_30 & 0x400) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\tFractionDigits:\t");
      pXVar1 = (XMLCh *)xercesc_4_0::XSSimpleTypeDefinition::getLexicalFacetValue
                                  ((FACET)xsBaseTypeDef);
      StrX::StrX((StrX *)&lexicalEnums,pXVar1);
      poVar2 = operator<<(poVar2,(StrX *)&lexicalEnums);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      StrX::~StrX((StrX *)&lexicalEnums);
    }
    if ((((local_30 & 0x800) != 0) &&
        (pBStack_a0 = (BaseRefVectorOf<char16_t> *)
                      xercesc_4_0::XSSimpleTypeDefinition::getLexicalEnumeration(),
        pBStack_a0 != (BaseRefVectorOf<char16_t> *)0x0)) &&
       (XVar3 = xercesc_4_0::BaseRefVectorOf<char16_t>::size(pBStack_a0), XVar3 != 0)) {
      std::operator<<((ostream *)&std::cout,"\tEnumeration:\n");
      for (local_a4 = 0; uVar4 = (ulong)local_a4,
          XVar3 = xercesc_4_0::BaseRefVectorOf<char16_t>::size(pBStack_a0), uVar4 < XVar3;
          local_a4 = local_a4 + 1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"\t\t\t");
        pcVar5 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(pBStack_a0,(ulong)local_a4);
        StrX::StrX(&local_b0,pcVar5);
        poVar2 = operator<<(poVar2,&local_b0);
        std::operator<<(poVar2,"\n");
        StrX::~StrX(&local_b0);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void processSimpleTypeDefinition(XSSimpleTypeDefinition * xsSimpleTypeDef)
{
    XSTypeDefinition *xsBaseTypeDef = xsSimpleTypeDef->getBaseType();
    std::cout << "Base:\t\t\t";
    std::cout << StrX(xsBaseTypeDef->getName()) << std::endl;

    int facets = xsSimpleTypeDef->getDefinedFacets();
    if (facets) {
        std::cout << "Facets:\n";

        if (facets & XSSimpleTypeDefinition::FACET_LENGTH)
                std::cout << "\tLength:\t\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_LENGTH)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MINLENGTH)
                std::cout << "\tMinLength:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MINLENGTH)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MAXLENGTH)
                std::cout << "\tMaxLength:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MAXLENGTH)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_PATTERN) {
            StringList *lexicalPatterns = xsSimpleTypeDef->getLexicalPattern();
            if (lexicalPatterns && lexicalPatterns->size()) {
                std::cout << "\tPattern:\t\t";
                for (unsigned i = 0; i < lexicalPatterns->size(); i++) {
                    std::cout << StrX(lexicalPatterns->elementAt(i));
                }
                std::cout << std::endl;
            }
        }
        if (facets & XSSimpleTypeDefinition::FACET_WHITESPACE)
                std::cout << "\tWhitespace:\t\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_WHITESPACE)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MAXINCLUSIVE)
                std::cout << "\tMaxInclusive:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MAXINCLUSIVE)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MAXEXCLUSIVE)
                std::cout << "\tMaxExclusive:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MAXEXCLUSIVE)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MINEXCLUSIVE)
                std::cout << "\tMinExclusive:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MINEXCLUSIVE)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_MININCLUSIVE)
                std::cout << "\tMinInclusive:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_MININCLUSIVE)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_TOTALDIGITS)
                std::cout << "\tTotalDigits:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_TOTALDIGITS)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_FRACTIONDIGITS)
                std::cout << "\tFractionDigits:\t" << StrX(xsSimpleTypeDef->getLexicalFacetValue(XSSimpleTypeDefinition::FACET_FRACTIONDIGITS)) << std::endl;
        if (facets & XSSimpleTypeDefinition::FACET_ENUMERATION) {
            StringList *lexicalEnums = xsSimpleTypeDef->getLexicalEnumeration();
            if (lexicalEnums && lexicalEnums->size()) {
                std::cout << "\tEnumeration:\n";
                for (unsigned i = 0; i < lexicalEnums->size(); i++) {
                    std::cout << "\t\t\t" << StrX(lexicalEnums->elementAt(i)) << "\n";
                }
                std::cout << std::endl;
            }
        }
    }
}